

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddMatMult.c
# Opt level: O2

DdNode * Cudd_addTriangle(DdManager *dd,DdNode *f,DdNode *g,DdNode **z,int nz)

{
  int *piVar1;
  uint uVar2;
  int *vars;
  ulong uVar3;
  ulong uVar4;
  DdNode *cube;
  DdNode *pDVar5;
  
  uVar2 = dd->size;
  vars = (int *)malloc((long)(int)uVar2 * 4);
  if (vars == (int *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    uVar3 = 0;
    uVar4 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar4 = uVar3;
    }
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      vars[uVar3] = -1;
    }
    uVar4 = 0;
    uVar3 = 0;
    if (0 < nz) {
      uVar3 = (ulong)(uint)nz;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      vars[z[uVar4]->index] = (int)uVar4;
    }
    cube = Cudd_addComputeCube(dd,z,(int *)0x0,nz);
    if (cube != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)cube & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      do {
        dd->reordered = 0;
        pDVar5 = addTriangleRecur(dd,f,g,vars,cube);
      } while (dd->reordered == 1);
      if (pDVar5 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,cube);
      }
      else {
        piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(dd,cube);
        piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
      }
      free(vars);
      return pDVar5;
    }
    free(vars);
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_addTriangle(
  DdManager * dd,
  DdNode * f,
  DdNode * g,
  DdNode ** z,
  int  nz)
{
    int    i, nvars, *vars;
    DdNode *res, *cube;

    nvars = dd->size;
    vars = ABC_ALLOC(int, nvars);
    if (vars == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < nvars; i++) vars[i] = -1;
    for (i = 0; i < nz; i++) vars[z[i]->index] = i;
    cube = Cudd_addComputeCube(dd, z, NULL, nz);
    if (cube == NULL) {
        ABC_FREE(vars);
        return(NULL);
    }
    cuddRef(cube);

    do {
        dd->reordered = 0;
        res = addTriangleRecur(dd, f, g, vars, cube);
    } while (dd->reordered == 1);
    if (res != NULL) cuddRef(res);
    Cudd_RecursiveDeref(dd,cube);
    if (res != NULL) cuddDeref(res);
    ABC_FREE(vars);
    return(res);

}